

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O1

void dummy_SimpleStoreArrayHelper(void)

{
  return;
}

Assistant:

void SimpleJitHelpers::StoreArraySegHelper(Var arr, uint32 index, Var value)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleStoreArraySegHelper);
        //Adapted from InterpreterStackFrame::OP_SetArraySegmentItem_CI4
        SparseArraySegment<Var> * segment = (SparseArraySegment<Var> *)arr;

        Assert(segment->left == 0);
        Assert(index < segment->length);

        segment->elements[index] = value;
        JIT_HELPER_END(SimpleStoreArraySegHelper);
    }